

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btcp.c
# Opt level: O0

void nn_btcp_shutdown(nn_fsm *self,int src,int type,void *srcptr)

{
  int iVar1;
  nn_atcp *pnVar2;
  nn_atcp *local_58;
  nn_fsm *local_40;
  nn_atcp *atcp;
  nn_list_item *it;
  nn_btcp *btcp;
  void *srcptr_local;
  int type_local;
  int src_local;
  nn_fsm *self_local;
  
  local_40 = self;
  if (self == (nn_fsm *)0x0) {
    local_40 = (nn_fsm *)0x0;
  }
  if (src == -2 && type == -3) {
    nn_backoff_stop((nn_backoff *)&local_40[8].stopped.src);
    if (local_40[8].owner == (nn_fsm *)0x0) {
      *(undefined4 *)&local_40[1].fn = 4;
    }
    else {
      nn_atcp_stop((nn_atcp *)local_40[8].owner);
      *(undefined4 *)&local_40[1].fn = 3;
    }
  }
  if (*(int *)&local_40[1].fn == 3) {
    iVar1 = nn_atcp_isidle((nn_atcp *)local_40[8].owner);
    if (iVar1 == 0) {
      return;
    }
    nn_atcp_term((nn_atcp *)local_40[8].owner);
    nn_free(local_40[8].owner);
    local_40[8].owner = (nn_fsm *)0x0;
    nn_usock_stop((nn_usock *)&local_40[1].srcptr);
    *(undefined4 *)&local_40[1].fn = 4;
  }
  if (*(int *)&local_40[1].fn == 4) {
    iVar1 = nn_usock_isidle((nn_usock *)&local_40[1].srcptr);
    if (iVar1 == 0) {
      return;
    }
    iVar1 = nn_backoff_isidle((nn_backoff *)&local_40[8].stopped.src);
    if (iVar1 == 0) {
      return;
    }
    for (atcp = (nn_atcp *)nn_list_begin((nn_list *)&local_40[8].ctx);
        pnVar2 = (nn_atcp *)nn_list_end((nn_list *)&local_40[8].ctx), atcp != pnVar2;
        atcp = (nn_atcp *)nn_list_next((nn_list *)&local_40[8].ctx,(nn_list_item *)atcp)) {
      if (atcp == (nn_atcp *)0x0) {
        local_58 = (nn_atcp *)0x0;
      }
      else {
        local_58 = (nn_atcp *)&atcp[-1].fsm.state;
      }
      nn_atcp_stop(local_58);
    }
    *(undefined4 *)&local_40[1].fn = 5;
  }
  else {
    if (*(int *)&local_40[1].fn != 5) {
      fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected action",
              (ulong)*(uint *)&local_40[1].fn,(ulong)(uint)src,(ulong)(uint)type,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/tcp/btcp.c"
              ,0x110);
      fflush(_stderr);
      nn_err_abort();
    }
    if (src != 2 || type != 0x85b9) {
      fprintf(_stderr,"Assertion failed: %s (%s:%d)\n",
              "src == NN_BTCP_SRC_ATCP && type == NN_ATCP_STOPPED",
              "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/tcp/btcp.c"
              ,0xfd);
      fflush(_stderr);
      nn_err_abort();
    }
    nn_list_erase((nn_list *)&local_40[8].ctx,(nn_list_item *)((long)srcptr + 0x730));
    nn_atcp_term((nn_atcp *)srcptr);
    nn_free(srcptr);
  }
  iVar1 = nn_list_empty((nn_list *)&local_40[8].ctx);
  if (iVar1 != 0) {
    *(undefined4 *)&local_40[1].fn = 1;
    nn_fsm_stopped_noevent(local_40);
    nn_epbase_stopped((nn_epbase *)&local_40[1].shutdown_fn);
  }
  return;
}

Assistant:

static void nn_btcp_shutdown (struct nn_fsm *self, int src, int type,
    void *srcptr)
{
    struct nn_btcp *btcp;
    struct nn_list_item *it;
    struct nn_atcp *atcp;

    btcp = nn_cont (self, struct nn_btcp, fsm);

    if (nn_slow (src == NN_FSM_ACTION && type == NN_FSM_STOP)) {
        nn_backoff_stop (&btcp->retry);
        if (btcp->atcp) {
            nn_atcp_stop (btcp->atcp);
            btcp->state = NN_BTCP_STATE_STOPPING_ATCP;
        }
        else {
            btcp->state = NN_BTCP_STATE_STOPPING_USOCK;
        }
    }
    if (nn_slow (btcp->state == NN_BTCP_STATE_STOPPING_ATCP)) {
        if (!nn_atcp_isidle (btcp->atcp))
            return;
        nn_atcp_term (btcp->atcp);
        nn_free (btcp->atcp);
        btcp->atcp = NULL;
        nn_usock_stop (&btcp->usock);
        btcp->state = NN_BTCP_STATE_STOPPING_USOCK;
    }
    if (nn_slow (btcp->state == NN_BTCP_STATE_STOPPING_USOCK)) {
       if (!nn_usock_isidle (&btcp->usock) ||
             !nn_backoff_isidle (&btcp->retry))
            return;
        for (it = nn_list_begin (&btcp->atcps);
              it != nn_list_end (&btcp->atcps);
              it = nn_list_next (&btcp->atcps, it)) {
            atcp = nn_cont (it, struct nn_atcp, item);
            nn_atcp_stop (atcp);
        }
        btcp->state = NN_BTCP_STATE_STOPPING_ATCPS;
        goto atcps_stopping;
    }
    if (nn_slow (btcp->state == NN_BTCP_STATE_STOPPING_ATCPS)) {
        nn_assert (src == NN_BTCP_SRC_ATCP && type == NN_ATCP_STOPPED);
        atcp = (struct nn_atcp *) srcptr;
        nn_list_erase (&btcp->atcps, &atcp->item);
        nn_atcp_term (atcp);
        nn_free (atcp);

        /*  If there are no more atcp state machines, we can stop the whole
            btcp object. */
atcps_stopping:
        if (nn_list_empty (&btcp->atcps)) {
            btcp->state = NN_BTCP_STATE_IDLE;
            nn_fsm_stopped_noevent (&btcp->fsm);
            nn_epbase_stopped (&btcp->epbase);
            return;
        }

        return;
    }

    nn_fsm_bad_action(btcp->state, src, type);
}